

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall net_tests::cnetaddr_unserialize_v2::test_method(cnetaddr_unserialize_v2 *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  string *psVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  check_type cVar7;
  char *pcVar6;
  char *local_e70;
  char *local_e68;
  undefined1 *local_e60;
  undefined1 *local_e58;
  char *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e38;
  undefined1 *local_e30;
  undefined1 *local_e28;
  char *local_e20;
  char *local_e18;
  char *local_e10;
  char *local_e08;
  undefined1 *local_e00;
  undefined1 *local_df8;
  char *local_df0;
  char *local_de8;
  char *local_de0;
  char *local_dd8;
  undefined1 *local_dd0;
  undefined1 *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  undefined1 *local_da0;
  undefined1 *local_d98;
  char *local_d90;
  char *local_d88;
  char *local_d50;
  char *local_d48;
  undefined1 *local_d40;
  undefined1 *local_d38;
  char *local_d30;
  char *local_d28;
  undefined1 *local_d20;
  undefined1 *local_d18;
  char *local_d10;
  char *local_d08;
  char *local_d00;
  char *local_cf8;
  undefined1 *local_cf0;
  undefined1 *local_ce8;
  char *local_ce0;
  char *local_cd8;
  char *local_ca0;
  char *local_c98;
  undefined1 *local_c90;
  undefined1 *local_c88;
  char *local_c80;
  char *local_c78;
  undefined1 *local_c70;
  undefined1 *local_c68;
  char *local_c60;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  undefined1 *local_c40;
  undefined1 *local_c38;
  char *local_c30;
  char *local_c28;
  char *local_c20;
  char *local_c18;
  undefined1 *local_c10;
  undefined1 *local_c08;
  char *local_c00;
  char *local_bf8;
  char *local_bf0;
  char *local_be8;
  undefined1 *local_be0;
  undefined1 *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  undefined1 *local_bb0;
  undefined1 *local_ba8;
  char *local_ba0;
  char *local_b98;
  char *local_b90;
  char *local_b88;
  undefined1 *local_b80;
  undefined1 *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  undefined1 *local_b50;
  undefined1 *local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  undefined1 *local_b20;
  undefined1 *local_b18;
  char *local_b10;
  char *local_b08;
  char *local_b00;
  char *local_af8;
  undefined1 *local_af0;
  undefined1 *local_ae8;
  char *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  undefined1 *local_ac0;
  undefined1 *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  char *local_8d0;
  char *local_8c8;
  undefined1 *local_8c0;
  undefined1 *local_8b8;
  char *local_8b0;
  char *local_8a8;
  undefined1 *local_8a0;
  undefined1 *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  undefined1 *local_720;
  undefined1 *local_718;
  char *local_710;
  char *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  undefined1 *local_580;
  undefined1 *local_578;
  char *local_570;
  char *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_270;
  char *local_268;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  SerParams ser_params;
  DataStream local_c8;
  undefined1 local_a8 [8];
  CNetAddr *pCStack_a0;
  undefined1 *local_98;
  char **ppcStack_90;
  byte local_88 [16];
  string local_78;
  CNetAddr addr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr(&addr);
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.m_read_pos = 0;
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ser_params.super_SerParams.enc = V2;
  ser_params.fmt = Network;
  local_a8._0_6_ = 0x40302010401;
  Serialize<DataStream,_std::byte,_6UL>(&local_c8,(array<std::byte,_6UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x198;
  file.m_begin = (iterator)&local_e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f0,msg);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsValid(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  ppcStack_90 = &local_270;
  local_270 = "addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_f8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,_cVar7,
             (size_t)&local_100,0x198);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x199;
  file_00.m_begin = (iterator)&local_110;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_120,
             msg_00);
  local_78._M_dataplus._M_p._0_1_ = addr.m_net == NET_IPV4;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsIPv4()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_128 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,_cVar7,
             (size_t)&local_130,0x199);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  file_01.m_end = (iterator)0x19a;
  file_01.m_begin = (iterator)&local_140;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_150,
             msg_01);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsAddrV1Compatible(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsAddrV1Compatible()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_158 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,_cVar7,
             (size_t)&local_160,0x19a);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  file_02.m_end = (iterator)0x19b;
  file_02.m_begin = (iterator)&local_170;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_180,
             msg_02);
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xc694e1;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_188 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_78,&addr);
  pcVar6 = "1.2.3.4";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
            (local_a8,&local_190,0x19b,1,2,psVar5,"addr.ToStringAddr()","1.2.3.4","\"1.2.3.4\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)psVar5;
  msg_03.m_begin = pvVar3;
  file_03.m_end = (iterator)0x19c;
  file_03.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1b0,
             msg_03);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1b8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_1c0,0x19c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8._0_4_ = 0x2010401;
  Serialize<DataStream,_std::byte,_4UL>(&local_c8,(array<std::byte,_4UL> *)local_a8);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  file_04.m_end = (iterator)0x1a2;
  file_04.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1e0,
             msg_04);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  file_05.m_end = (iterator)0x1a2;
  file_05.m_begin = (iterator)&local_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_200,
             msg_05);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xb50500;
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_208 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,1,WARN,(check_type)pcVar6,
             (size_t)&local_210,0x1a2);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  file_06.m_end = (iterator)0x1a3;
  file_06.m_begin = (iterator)&local_290;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2a0,
             msg_06);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start != local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_2a8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_2b0,0x1a3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  local_a8._0_6_ = 0x40302010501;
  Serialize<DataStream,_std::byte,_6UL>(&local_c8,(array<std::byte,_6UL> *)local_a8);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  file_07.m_end = (iterator)0x1ab;
  file_07.m_begin = (iterator)&local_2c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2d0,
             msg_07);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  file_08.m_end = (iterator)0x1ab;
  file_08.m_begin = (iterator)&local_2e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f0,
             msg_08);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xb50500;
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_2f8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,1,WARN,(check_type)pcVar6,
             (size_t)&local_300,0x1ab);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  file_09.m_end = (iterator)0x1ac;
  file_09.m_begin = (iterator)&local_340;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_350,
             msg_09);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start != local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_360 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_358 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_360,0x1ac);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  local_a8[0] = 1;
  local_a8[1] = 0xfd;
  local_a8[2] = 1;
  local_a8[3] = 2;
  local_a8[4] = 1;
  local_a8[5] = 2;
  local_a8[6] = 3;
  local_a8[7] = 4;
  Serialize<DataStream,_std::byte,_8UL>(&local_c8,(array<std::byte,_8UL> *)local_a8);
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  file_10.m_end = (iterator)0x1b4;
  file_10.m_begin = (iterator)&local_370;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_380,
             msg_10);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  file_11.m_end = (iterator)0x1b4;
  file_11.m_begin = (iterator)&local_390;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3a0,
             msg_11);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xb50500;
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_3a8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,1,WARN,(check_type)pcVar6,
             (size_t)&local_3b0,0x1b4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  file_12.m_end = (iterator)0x1b5;
  file_12.m_begin = (iterator)&local_3f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_400,
             msg_12);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start != local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_408 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_410,0x1b5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  local_a8 = (undefined1  [8])0x605040302011002;
  pCStack_a0 = (CNetAddr *)0xe0d0c0b0a090807;
  local_98 = (undefined1 *)CONCAT62(local_98._2_6_,0x100f);
  Serialize<DataStream,_std::byte,_18UL>(&local_c8,(array<std::byte,_18UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  file_13.m_end = (iterator)0x1bd;
  file_13.m_begin = (iterator)&local_420;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_430,
             msg_13);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsValid(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_438 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_440,0x1bd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_14.m_end = pvVar4;
  msg_14.m_begin = pvVar3;
  file_14.m_end = (iterator)0x1be;
  file_14.m_begin = (iterator)&local_450;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_460,
             msg_14);
  local_78._M_dataplus._M_p._0_1_ = addr.m_net == NET_IPV6;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsIPv6()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_468 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_470,0x1be);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_15.m_end = pvVar4;
  msg_15.m_begin = pvVar3;
  file_15.m_end = (iterator)0x1bf;
  file_15.m_begin = (iterator)&local_480;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_490,
             msg_15);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsAddrV1Compatible(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsAddrV1Compatible()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_498 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_4a0,0x1bf);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_16.m_end = pvVar4;
  msg_16.m_begin = pvVar3;
  file_16.m_end = (iterator)0x1c0;
  file_16.m_begin = (iterator)&local_4b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4c0,
             msg_16);
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xc694e1;
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_4c8 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_78,&addr);
  pcVar6 = "102:304:506:708:90a:b0c:d0e:f10";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[32]>
            (local_a8,&local_4d0,0x1c0,1,2,psVar5,"addr.ToStringAddr()",
             "102:304:506:708:90a:b0c:d0e:f10","\"102:304:506:708:90a:b0c:d0e:f10\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_17.m_end = (iterator)psVar5;
  msg_17.m_begin = pvVar3;
  file_17.m_end = (iterator)0x1c1;
  file_17.m_begin = (iterator)&local_4e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4f0,
             msg_17);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_4f8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_500,0x1c1);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8 = (undefined1  [8])0x2487c0886bfd1002;
  pCStack_a0 = (CNetAddr *)0xcabd1bca128197ca;
  local_98 = (undefined1 *)CONCAT62(local_98._2_6_,0xc2fa);
  Serialize<DataStream,_std::byte,_18UL>(&local_c8,(array<std::byte,_18UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_18.m_end = pvVar4;
  msg_18.m_begin = pvVar3;
  file_18.m_end = (iterator)0x1c9;
  file_18.m_begin = (iterator)&local_510;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_520,
             msg_18);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsInternal(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsInternal()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_528 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_530,0x1c9);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_19.m_end = pvVar4;
  msg_19.m_begin = pvVar3;
  file_19.m_end = (iterator)0x1ca;
  file_19.m_begin = (iterator)&local_540;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_550,
             msg_19);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsAddrV1Compatible(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsAddrV1Compatible()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_558 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_560,0x1ca);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_570 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_568 = "";
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  local_578 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_20.m_end = pvVar4;
  msg_20.m_begin = pvVar3;
  file_20.m_end = (iterator)0x1cb;
  file_20.m_begin = (iterator)&local_570;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_580,
             msg_20);
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xc694e1;
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_588 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_78,&addr);
  pcVar6 = "zklycewkdo64v6wc.internal";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[26]>
            (local_a8,&local_590,0x1cb,1,2,psVar5,"addr.ToStringAddr()","zklycewkdo64v6wc.internal",
             "\"zklycewkdo64v6wc.internal\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_5a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_21.m_end = (iterator)psVar5;
  msg_21.m_begin = pvVar3;
  file_21.m_end = (iterator)0x1cc;
  file_21.m_begin = (iterator)&local_5a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5b0,
             msg_21);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_5b8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_5c0,0x1cc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8._2_6_ = local_a8._2_6_ & 0xffffffffff00;
  local_a8._0_2_ = 0x402;
  Serialize<DataStream,_std::byte,_3UL>(&local_c8,(array<std::byte,_3UL> *)local_a8);
  local_5d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_22.m_end = pvVar4;
  msg_22.m_begin = pvVar3;
  file_22.m_end = (iterator)0x1d3;
  file_22.m_begin = (iterator)&local_5d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_5e0,
             msg_22);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_23.m_end = pvVar4;
  msg_23.m_begin = pvVar3;
  file_23.m_end = (iterator)0x1d3;
  file_23.m_begin = (iterator)&local_5f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_600,
             msg_23);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xb50500;
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_608 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,1,WARN,(check_type)pcVar6,
             (size_t)&local_610,0x1d3);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_650 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_24.m_end = pvVar4;
  msg_24.m_begin = pvVar3;
  file_24.m_end = (iterator)0x1d4;
  file_24.m_begin = (iterator)&local_650;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_660,
             msg_24);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start != local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_670 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_668 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_670,0x1d4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  local_a8 = (undefined1  [8])0x1002;
  pCStack_a0 = (CNetAddr *)0x201ffff00000000;
  local_98 = (undefined1 *)CONCAT62(local_98._2_6_,0x403);
  Serialize<DataStream,_std::byte,_18UL>(&local_c8,(array<std::byte,_18UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_25.m_end = pvVar4;
  msg_25.m_begin = pvVar3;
  file_25.m_end = (iterator)0x1dc;
  file_25.m_begin = (iterator)&local_680;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_690,
             msg_25);
  bVar2 = CNetAddr::IsValid(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_698 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_6a0,0x1dc);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_6b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_26.m_end = pvVar4;
  msg_26.m_begin = pvVar3;
  file_26.m_end = (iterator)0x1dd;
  file_26.m_begin = (iterator)&local_6b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6c0,
             msg_26);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_6d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6c8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_6d0,0x1dd);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8 = (undefined1  [8])0x43eb7ed887fd1002;
  pCStack_a0 = (CNetAddr *)0x807060504030201;
  local_98 = (undefined1 *)CONCAT62(local_98._2_6_,0xa09);
  Serialize<DataStream,_std::byte,_18UL>(&local_c8,(array<std::byte,_18UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_27.m_end = pvVar4;
  msg_27.m_begin = pvVar3;
  file_27.m_end = (iterator)0x1e4;
  file_27.m_begin = (iterator)&local_6e0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_6f0,
             msg_27);
  bVar2 = CNetAddr::IsValid(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6f8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_700,0x1e4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_708 = "";
  local_720 = &boost::unit_test::basic_cstring<char_const>::null;
  local_718 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_28.m_end = pvVar4;
  msg_28.m_begin = pvVar3;
  file_28.m_end = (iterator)0x1e5;
  file_28.m_begin = (iterator)&local_710;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_720,
             msg_28);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_730 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_728 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_730,0x1e5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8[0] = 3;
  local_a8[1] = 10;
  local_a8[2] = 0xf1;
  local_a8[3] = 0xf2;
  local_a8[4] = 0xf3;
  local_a8[5] = 0xf4;
  local_a8[6] = 0xf5;
  local_a8[7] = 0xf6;
  pCStack_a0 = (CNetAddr *)CONCAT44(pCStack_a0._4_4_,0xfaf9f8f7);
  Serialize<DataStream,_std::byte,_12UL>(&local_c8,(array<std::byte,_12UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_29.m_end = pvVar4;
  msg_29.m_begin = pvVar3;
  file_29.m_end = (iterator)0x1ec;
  file_29.m_begin = (iterator)&local_740;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_750,
             msg_29);
  bVar2 = CNetAddr::IsValid(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_760 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_758 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_760,0x1ec);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_30.m_end = pvVar4;
  msg_30.m_begin = pvVar3;
  file_30.m_end = (iterator)0x1ed;
  file_30.m_begin = (iterator)&local_770;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_780,
             msg_30);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_790 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_788 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_790,0x1ed);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_98 = (undefined1 *)0xb16f55f6f769046b;
  ppcStack_90 = (char **)0xa3dd409ba78931ac;
  local_a8 = (undefined1  [8])0x4b1825c6bc792004;
  pCStack_a0 = (CNetAddr *)0xb6668bc275491905;
  local_88[0] = 0x2f;
  local_88[1] = 0x1f;
  Serialize<DataStream,_std::byte,_34UL>(&local_c8,(array<std::byte,_34UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_31.m_end = pvVar4;
  msg_31.m_begin = pvVar3;
  file_31.m_end = (iterator)0x1f5;
  file_31.m_begin = (iterator)&local_7a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_7b0,
             msg_31);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsValid(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_7b8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_7c0,0x1f5);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_32.m_end = pvVar4;
  msg_32.m_begin = pvVar3;
  file_32.m_end = (iterator)0x1f6;
  file_32.m_begin = (iterator)&local_7d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_7e0,
             msg_32);
  local_78._M_dataplus._M_p._0_1_ = addr.m_net == NET_ONION;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsTor()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_7f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_7e8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_7f0,0x1f6);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_33.m_end = pvVar4;
  msg_33.m_begin = pvVar3;
  file_33.m_end = (iterator)0x1f7;
  file_33.m_begin = (iterator)&local_800;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_810,
             msg_33);
  bVar2 = CNetAddr::IsAddrV1Compatible(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsAddrV1Compatible()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_818 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_820,0x1f7);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_34.m_end = pvVar4;
  msg_34.m_begin = pvVar3;
  file_34.m_end = (iterator)0x1f9;
  file_34.m_begin = (iterator)&local_830;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_840,
             msg_34);
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xc694e1;
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_848 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_78,&addr);
  pcVar6 = "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[63]>
            (local_a8,&local_850,0x1f9,1,2,psVar5,"addr.ToStringAddr()",
             "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion",
             "\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_35.m_end = (iterator)psVar5;
  msg_35.m_begin = pvVar3;
  file_35.m_end = (iterator)0x1fa;
  file_35.m_begin = (iterator)&local_860;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_870,
             msg_35);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_878 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_880,0x1fa);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8._2_6_ = local_a8._2_6_ & 0xffffffffff00;
  local_a8._0_2_ = 4;
  Serialize<DataStream,_std::byte,_3UL>(&local_c8,(array<std::byte,_3UL> *)local_a8);
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_888 = "";
  local_8a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_898 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_36.m_end = pvVar4;
  msg_36.m_begin = pvVar3;
  file_36.m_end = (iterator)0x201;
  file_36.m_begin = (iterator)&local_890;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_8a0,
             msg_36);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_8b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_8a8 = "";
  local_8c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_37.m_end = pvVar4;
  msg_37.m_begin = pvVar3;
  file_37.m_end = (iterator)0x201;
  file_37.m_begin = (iterator)&local_8b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_8c0,
             msg_37);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xb50500;
  local_8d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_8c8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,1,WARN,(check_type)pcVar6,
             (size_t)&local_8d0,0x201);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_38.m_end = pvVar4;
  msg_38.m_begin = pvVar3;
  file_38.m_end = (iterator)0x202;
  file_38.m_begin = (iterator)&local_910;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_920,
             msg_38);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start != local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_928 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_930,0x202);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  local_98 = (undefined1 *)0xd442ae3282f9648b;
  ppcStack_90 = (char **)0xe3df5219a82ffdb6;
  local_a8 = (undefined1  [8])0xc0aeab4d89a22005;
  pCStack_a0 = (CNetAddr *)0xc8daa681a451008c;
  local_88[0] = 0x6a;
  local_88[1] = 0x87;
  Serialize<DataStream,_std::byte,_34UL>(&local_c8,(array<std::byte,_34UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_39.m_end = pvVar4;
  msg_39.m_begin = pvVar3;
  file_39.m_end = (iterator)0x20b;
  file_39.m_begin = (iterator)&local_940;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_950,
             msg_39);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsValid(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_958 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_960,0x20b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_40.m_end = pvVar4;
  msg_40.m_begin = pvVar3;
  file_40.m_end = (iterator)0x20c;
  file_40.m_begin = (iterator)&local_970;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_980,
             msg_40);
  local_78._M_dataplus._M_p._0_1_ = addr.m_net == NET_I2P;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsI2P()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_988 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_990,0x20c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_998 = "";
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_41.m_end = pvVar4;
  msg_41.m_begin = pvVar3;
  file_41.m_end = (iterator)0x20d;
  file_41.m_begin = (iterator)&local_9a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_9b0,
             msg_41);
  bVar2 = CNetAddr::IsAddrV1Compatible(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsAddrV1Compatible()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_9b8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_9c0,0x20d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_42.m_end = pvVar4;
  msg_42.m_begin = pvVar3;
  file_42.m_end = (iterator)0x20f;
  file_42.m_begin = (iterator)&local_9d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_9e0,
             msg_42);
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xc694e1;
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_9e8 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_78,&addr);
  pcVar6 = "ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[61]>
            (local_a8,&local_9f0,0x20f,1,2,psVar5,"addr.ToStringAddr()",
             "ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p",
             "\"ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_a00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_9f8 = "";
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_43.m_end = (iterator)psVar5;
  msg_43.m_begin = pvVar3;
  file_43.m_end = (iterator)0x210;
  file_43.m_begin = (iterator)&local_a00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_a10,
             msg_43);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_a20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a18 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_a20,0x210);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8._2_6_ = local_a8._2_6_ & 0xffffffffff00;
  local_a8._0_2_ = 0x305;
  Serialize<DataStream,_std::byte,_3UL>(&local_c8,(array<std::byte,_3UL> *)local_a8);
  local_a30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a28 = "";
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_44.m_end = pvVar4;
  msg_44.m_begin = pvVar3;
  file_44.m_end = (iterator)0x217;
  file_44.m_begin = (iterator)&local_a30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_a40,
             msg_44);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_a50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a48 = "";
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_45.m_end = pvVar4;
  msg_45.m_begin = pvVar3;
  file_45.m_end = (iterator)0x217;
  file_45.m_begin = (iterator)&local_a50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_a60,
             msg_45);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xb50500;
  local_a70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a68 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,1,WARN,(check_type)pcVar6,
             (size_t)&local_a70,0x217);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_ab0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_aa8 = "";
  local_ac0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_46.m_end = pvVar4;
  msg_46.m_begin = pvVar3;
  file_46.m_end = (iterator)0x218;
  file_46.m_begin = (iterator)&local_ab0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_ac0,
             msg_46);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start != local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_ad0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_ac8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_ad0,0x218);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  local_a8 = (undefined1  [8])0x200010000fc1006;
  pCStack_a0 = (CNetAddr *)0x600050004000300;
  local_98 = (undefined1 *)CONCAT62(local_98._2_6_,0x700);
  Serialize<DataStream,_std::byte,_18UL>(&local_c8,(array<std::byte,_18UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_ae0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_ad8 = "";
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_47.m_end = pvVar4;
  msg_47.m_begin = pvVar3;
  file_47.m_end = (iterator)0x220;
  file_47.m_begin = (iterator)&local_ae0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_af0,
             msg_47);
  local_78._M_dataplus._M_p._0_1_ = CNetAddr::IsValid(&addr);
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_b00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_af8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_b00,0x220);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_b10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b08 = "";
  local_b20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_48.m_end = pvVar4;
  msg_48.m_begin = pvVar3;
  file_48.m_end = (iterator)0x221;
  file_48.m_begin = (iterator)&local_b10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_b20,
             msg_48);
  local_78._M_dataplus._M_p._0_1_ = addr.m_net == NET_CJDNS;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsCJDNS()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_b30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b28 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_b30,0x221);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_b40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b38 = "";
  local_b50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b48 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_49.m_end = pvVar4;
  msg_49.m_begin = pvVar3;
  file_49.m_end = (iterator)0x222;
  file_49.m_begin = (iterator)&local_b40;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_b50,
             msg_49);
  bVar2 = CNetAddr::IsAddrV1Compatible(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsAddrV1Compatible()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_b60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b58 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_b60,0x222);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_b70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b68 = "";
  local_b80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_50.m_end = pvVar4;
  msg_50.m_begin = pvVar3;
  file_50.m_end = (iterator)0x223;
  file_50.m_begin = (iterator)&local_b70;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_b80,
             msg_50);
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_01139f30;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xc694e1;
  local_b90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b88 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_78,&addr);
  pcVar6 = "fc00:1:2:3:4:5:6:7";
  pvVar3 = (iterator)0x2;
  psVar5 = &local_78;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
            (local_a8,&local_b90,0x223,1,2,psVar5,"addr.ToStringAddr()","fc00:1:2:3:4:5:6:7",
             "\"fc00:1:2:3:4:5:6:7\"");
  std::__cxx11::string::~string((string *)&local_78);
  local_ba0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b98 = "";
  local_bb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ba8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_51.m_end = (iterator)psVar5;
  msg_51.m_begin = pvVar3;
  file_51.m_end = (iterator)0x224;
  file_51.m_begin = (iterator)&local_ba0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_bb0,
             msg_51);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_bc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_bb8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_bc0,0x224);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8 = (undefined1  [8])0x200010000aa1006;
  pCStack_a0 = (CNetAddr *)0x600050004000300;
  local_98 = (undefined1 *)CONCAT62(local_98._2_6_,0x700);
  Serialize<DataStream,_std::byte,_18UL>(&local_c8,(array<std::byte,_18UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_bd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_bc8 = "";
  local_be0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bd8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_52.m_end = pvVar4;
  msg_52.m_begin = pvVar3;
  file_52.m_end = (iterator)0x22b;
  file_52.m_begin = (iterator)&local_bd0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_be0,
             msg_52);
  local_78._M_dataplus._M_p._0_1_ = addr.m_net == NET_CJDNS;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "addr.IsCJDNS()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_bf0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_be8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_bf0,0x22b);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_c00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_bf8 = "";
  local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c08 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_53.m_end = pvVar4;
  msg_53.m_begin = pvVar3;
  file_53.m_end = (iterator)0x22c;
  file_53.m_begin = (iterator)&local_c00;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_c10,
             msg_53);
  bVar2 = CNetAddr::IsValid(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_c20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c18 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_c20,0x22c);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_c30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c28 = "";
  local_c40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_54.m_end = pvVar4;
  msg_54.m_begin = pvVar3;
  file_54.m_end = (iterator)0x22d;
  file_54.m_begin = (iterator)&local_c30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_c40,
             msg_54);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_c50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c48 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_c50,0x22d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8._2_6_ = local_a8._2_6_ & 0xffffffffff00;
  local_a8._0_2_ = 0x106;
  Serialize<DataStream,_std::byte,_3UL>(&local_c8,(array<std::byte,_3UL> *)local_a8);
  local_c60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c58 = "";
  local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c68 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_55.m_end = pvVar4;
  msg_55.m_begin = pvVar3;
  file_55.m_end = (iterator)0x234;
  file_55.m_begin = (iterator)&local_c60;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_c70,
             msg_55);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_c80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c78 = "";
  local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c88 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_56.m_end = pvVar4;
  msg_56.m_begin = pvVar3;
  file_56.m_end = (iterator)0x234;
  file_56.m_begin = (iterator)&local_c80;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_c90,
             msg_56);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xb50500;
  local_ca0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c98 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,1,WARN,(check_type)pcVar6,
             (size_t)&local_ca0,0x234);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_ce0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_cd8 = "";
  local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ce8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_57.m_end = pvVar4;
  msg_57.m_begin = pvVar3;
  file_57.m_end = (iterator)0x235;
  file_57.m_begin = (iterator)&local_ce0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_cf0,
             msg_57);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start != local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_d00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_cf8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_d00,0x235);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  local_a8[0] = 0xaa;
  local_a8[1] = 0xfe;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_a8[5] = 2;
  local_a8[6] = 1;
  local_a8[7] = 2;
  pCStack_a0 = (CNetAddr *)CONCAT35(pCStack_a0._5_3_,0x700000000);
  pCStack_a0 = (CNetAddr *)CONCAT44(pCStack_a0._4_4_,0x6050403);
  Serialize<DataStream,_std::byte,_13UL>(&local_c8,(array<std::byte,_13UL> *)local_a8);
  local_d10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d08 = "";
  local_d20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_58.m_end = pvVar4;
  msg_58.m_begin = pvVar3;
  file_58.m_end = (iterator)0x23d;
  file_58.m_begin = (iterator)&local_d10;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_d20,
             msg_58);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_d30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d28 = "";
  local_d40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d38 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_59.m_end = pvVar4;
  msg_59.m_begin = pvVar3;
  file_59.m_end = (iterator)0x23d;
  file_59.m_begin = (iterator)&local_d30;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_d40,
             msg_59);
  local_78._M_dataplus._M_p._0_1_ = 0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = (char **)0xb50500;
  local_d50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d48 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,1,WARN,(check_type)pcVar6,
             (size_t)&local_d50,0x23d);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_d90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d88 = "";
  local_da0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d98 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_60.m_end = pvVar4;
  msg_60.m_begin = pvVar3;
  file_60.m_end = (iterator)0x23e;
  file_60.m_begin = (iterator)&local_d90;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_da0,
             msg_60);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start != local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_db0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_da8 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_db0,0x23e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  if (local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_c8.m_read_pos = 0;
  local_a8._0_6_ = 0x403020104aa;
  Serialize<DataStream,_std::byte,_6UL>(&local_c8,(array<std::byte,_6UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_dc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_db8 = "";
  local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dc8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_61.m_end = pvVar4;
  msg_61.m_begin = pvVar3;
  file_61.m_end = (iterator)0x246;
  file_61.m_begin = (iterator)&local_dc0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_dd0,
             msg_61);
  bVar2 = CNetAddr::IsValid(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_de0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_dd8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_de0,0x246);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_df0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_de8 = "";
  local_e00 = &boost::unit_test::basic_cstring<char_const>::null;
  local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_62.m_end = pvVar4;
  msg_62.m_begin = pvVar3;
  file_62.m_end = (iterator)0x247;
  file_62.m_begin = (iterator)&local_df0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_e00,
             msg_62);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_e10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e08 = "";
  pvVar3 = (iterator)0x2;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_e10,0x247);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_a8._0_2_ = 0xaa;
  Serialize<DataStream,_std::byte,_2UL>(&local_c8,(array<std::byte,_2UL> *)local_a8);
  local_a8 = (undefined1  [8])&ser_params;
  pCStack_a0 = &addr;
  ParamsWrapper<CAddress::SerParams,_CNetAddr>::Unserialize<DataStream>
            ((ParamsWrapper<CAddress::SerParams,_CNetAddr> *)local_a8,&local_c8);
  local_e20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e18 = "";
  local_e30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e28 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_63.m_end = pvVar4;
  msg_63.m_begin = pvVar3;
  file_63.m_end = (iterator)0x24e;
  file_63.m_begin = (iterator)&local_e20;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_e30,
             msg_63);
  bVar2 = CNetAddr::IsValid(&addr);
  local_78._M_dataplus._M_p._0_1_ = !bVar2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "!addr.IsValid()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_e40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e38 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,1,0,WARN,(check_type)pcVar6,
             (size_t)&local_e40,0x24e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  local_e50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e48 = "";
  local_e60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_64.m_end = pvVar4;
  msg_64.m_begin = pvVar3;
  file_64.m_end = (iterator)0x24f;
  file_64.m_begin = (iterator)&local_e50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_e60,
             msg_64);
  local_78._M_dataplus._M_p._0_1_ =
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_c8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_start == local_c8.m_read_pos;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_270 = "s.empty()";
  local_268 = "";
  pCStack_a0 = (CNetAddr *)((ulong)pCStack_a0 & 0xffffffffffffff00);
  local_a8 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
  local_98 = boost::unit_test::lazy_ostream::inst;
  ppcStack_90 = &local_270;
  local_e70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e68 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_78,(lazy_ostream *)local_a8,2,0,WARN,(check_type)pcVar6,
             (size_t)&local_e70,0x24f);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_78.field_2._M_allocated_capacity);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_c8);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::~prevector(&addr.m_addr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_unserialize_v2)
{
    CNetAddr addr;
    DataStream s{};
    const auto ser_params{CAddress::V2_NETWORK};

    // Valid IPv4.
    s << "01"            // network type (IPv4)
         "04"            // address length
         "01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsIPv4());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "1.2.3.4");
    BOOST_REQUIRE(s.empty());

    // Invalid IPv4, valid length but address itself is shorter.
    s << "01"        // network type (IPv4)
         "04"        // address length
         "0102"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure, HasReason("end of data"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv4, with bogus length.
    s << "01"            // network type (IPv4)
         "05"            // address length
         "01020304"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 IPv4 address with length 5 (should be 4)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv4, with extreme length.
    s << "01"            // network type (IPv4)
         "fd0102"        // address length (513 as CompactSize)
         "01020304"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("Address too long: 513 > 512"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid IPv6.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "0102030405060708090a0b0c0d0e0f10"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsIPv6());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "102:304:506:708:90a:b0c:d0e:f10");
    BOOST_REQUIRE(s.empty());

    // Valid IPv6, contains embedded "internal".
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "fd6b88c08724ca978112ca1bbdcafac2"_hex; // address: 0xfd + sha256("bitcoin")[0:5] +
                                                 // sha256(name)[0:10]
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsInternal());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "zklycewkdo64v6wc.internal");
    BOOST_REQUIRE(s.empty());

    // Invalid IPv6, with bogus length.
    s << "02"      // network type (IPv6)
         "04"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 IPv6 address with length 4 (should be 16)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv6, contains embedded IPv4.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "00000000000000000000ffff01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Invalid IPv6, contains embedded TORv2.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "fd87d87eeb430102030405060708090a"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // TORv2, no longer supported.
    s << "03"                        // network type (TORv2)
         "0a"                        // address length
         "f1f2f3f4f5f6f7f8f9fa"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Valid TORv3.
    s << "04"                               // network type (TORv3)
         "20"                               // address length
         "79bcc625184b05194975c28b66b66b04" // address
         "69f7f6556fb1ac3189a79b40dda32f1f"_hex;
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsTor());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(),
                      "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion");
    BOOST_REQUIRE(s.empty());

    // Invalid TORv3, with bogus length.
    s << "04"      // network type (TORv3)
         "00"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 TORv3 address with length 0 (should be 32)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid I2P.
    s << "05"                               // network type (I2P)
         "20"                               // address length
         "a2894dabaec08c0051a481a6dac88b64" // address
         "f98232ae42d4b6fd2fa81952dfe36a87"_hex;
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsI2P());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(),
                      "ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p");
    BOOST_REQUIRE(s.empty());

    // Invalid I2P, with bogus length.
    s << "05"      // network type (I2P)
         "03"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 I2P address with length 3 (should be 32)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid CJDNS.
    s << "06"                                    // network type (CJDNS)
         "10"                                    // address length
         "fc000001000200030004000500060007"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsCJDNS());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "fc00:1:2:3:4:5:6:7");
    BOOST_REQUIRE(s.empty());

    // Invalid CJDNS, wrong prefix.
    s << "06"                                    // network type (CJDNS)
         "10"                                    // address length
         "aa000001000200030004000500060007"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsCJDNS());
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Invalid CJDNS, with bogus length.
    s << "06"      // network type (CJDNS)
         "01"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 CJDNS address with length 1 (should be 16)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Unknown, with extreme length.
    s << "aa"                  // network type (unknown)
         "fe00000002"          // address length (CompactSize's MAX_SIZE)
         "01020304050607"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("Address too long: 33554432 > 512"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Unknown, with reasonable length.
    s << "aa"            // network type (unknown)
         "04"            // address length
         "01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Unknown, with zero length.
    s << "aa"    // network type (unknown)
         "00"    // address length
         ""_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());
}